

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O2

void __thiscall Imath_3_2::half::half(half *this,float f)

{
  char cVar1;
  ushort uVar2;
  float fVar3;
  uint uVar4;
  
  fVar3 = ABS(f);
  uVar2 = (ushort)((uint)f >> 0x10) & 0x8000;
  if ((uint)fVar3 < 0x38800000) {
    if ((0x33000000 < (uint)fVar3) &&
       (uVar4 = (uint)f & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar3 >> 0x17),
       uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
       0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
      uVar2 = uVar2 + 1;
    }
  }
  else if ((uint)fVar3 < 0x7f800000) {
    if ((uint)fVar3 < 0x477ff000) {
      uVar2 = (ushort)((int)fVar3 + 0x8000fffU + (uint)(((uint)fVar3 >> 0xd & 1) != 0) >> 0xd) |
              uVar2;
    }
    else {
      uVar2 = uVar2 | 0x7c00;
    }
  }
  else {
    uVar2 = uVar2 | 0x7c00;
    if (fVar3 != INFINITY) {
      uVar4 = (uint)fVar3 >> 0xd & 0x3ff;
      uVar2 = uVar2 | (ushort)uVar4 | (ushort)(uVar4 == 0);
    }
  }
  this->_h = uVar2;
  return;
}

Assistant:

inline half::half (float f) IMATH_NOEXCEPT : _h (imath_float_to_half (f))
{}